

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void ravi_dump_stacktop(lua_State *L,char *s)

{
  int ci_top;
  int top;
  int funcpos;
  CallInfo *ci;
  char *s_local;
  lua_State *L_local;
  
  printf("Stack dump %s function %d L->top = %d, ci->top = %d\n",s,
         (long)L->ci->func - (long)L->stack >> 4 & 0xffffffff,
         (long)L->top - (long)L->stack >> 4 & 0xffffffff,
         (long)L->ci->top - (long)L->stack >> 4 & 0xffffffff);
  return;
}

Assistant:

void ravi_dump_stacktop(lua_State *L, const char *s) {
  CallInfo *ci = L->ci;
  int funcpos = (int)(ci->func - L->stack);
  int top = (int)(L->top - L->stack);
  int ci_top = (int)(ci->top - L->stack);
  printf("Stack dump %s function %d L->top = %d, ci->top = %d\n", s, funcpos,
         top, ci_top);
}